

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

void __thiscall
Fossilize::ApplicationInfoFilter::~ApplicationInfoFilter(ApplicationInfoFilter *this)

{
  Impl *this_00;
  ApplicationInfoFilter *this_local;
  
  this_00 = this->impl;
  if (this_00 != (Impl *)0x0) {
    Impl::~Impl(this_00);
    operator_delete(this_00,0x120);
  }
  return;
}

Assistant:

ApplicationInfoFilter::~ApplicationInfoFilter()
{
	delete impl;
}